

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O3

void test_2d_static<0ul,1ul,1ul,30ul>(void)

{
  int j;
  bool *pbVar1;
  bool *pbVar2;
  size_t true_idx;
  int dptr [31];
  bool *local_d0;
  bool *local_c8;
  bool *local_c0;
  bool local_b8 [136];
  
  local_b8[0] = true;
  local_c8 = (bool *)CONCAT71(local_c8._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",local_b8,
             (bool *)&local_c8);
  local_b8[0] = true;
  local_b8[1] = false;
  local_b8[2] = false;
  local_b8[3] = false;
  local_b8[4] = false;
  local_b8[5] = false;
  local_b8[6] = false;
  local_b8[7] = false;
  local_c8._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_b8,(int *)&local_c8);
  local_b8[0] = true;
  local_b8[1] = false;
  local_b8[2] = false;
  local_b8[3] = false;
  local_b8[4] = false;
  local_b8[5] = false;
  local_b8[6] = false;
  local_b8[7] = false;
  local_c8 = (bool *)CONCAT44(local_c8._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_b8,(int *)&local_c8);
  local_b8[0] = true;
  local_b8[1] = false;
  local_b8[2] = false;
  local_b8[3] = false;
  local_b8[4] = false;
  local_b8[5] = false;
  local_b8[6] = false;
  local_b8[7] = false;
  local_c8 = (bool *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_b8,(unsigned_long *)&local_c8);
  local_b8[0] = true;
  local_b8[1] = false;
  local_b8[2] = false;
  local_b8[3] = false;
  local_b8[4] = false;
  local_b8[5] = false;
  local_b8[6] = false;
  local_b8[7] = false;
  local_c8 = (bool *)0x1f;
  pbVar2 = local_b8;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)pbVar2,(unsigned_long *)&local_c8);
  pbVar1 = (bool *)0x0;
  do {
    local_d0 = pbVar1;
    local_c8 = pbVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x2d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_d0,(unsigned_long *)&local_c8);
    local_c0 = local_b8 + (long)local_c8 * 4;
    local_d0 = pbVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x2f,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int **)&local_d0
               ,(int **)&local_c0);
    pbVar2[0] = true;
    pbVar2[1] = false;
    pbVar2[2] = false;
    pbVar2[3] = false;
    local_d0 = (bool *)CONCAT44(local_d0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x33,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)pbVar2,
               (int *)&local_d0);
    pbVar1 = pbVar1 + 1;
    pbVar2 = pbVar2 + 4;
  } while (pbVar1 != (bool *)0x1e);
  pbVar2 = local_b8;
  pbVar1 = (bool *)0x0;
  while( true ) {
    local_d0 = pbVar1;
    local_c8 = pbVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x3c,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_d0,(unsigned_long *)&local_c8);
    local_c0 = local_b8 + (long)local_c8 * 4;
    local_d0 = pbVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x3e,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int **)&local_d0
               ,(int **)&local_c0);
    if (pbVar1 == (bool *)0x1e) break;
    pbVar1 = pbVar1 + 1;
    pbVar2 = pbVar2 + 4;
  }
  pbVar2[0] = true;
  pbVar2[1] = false;
  pbVar2[2] = false;
  pbVar2[3] = false;
  local_d0 = (bool *)CONCAT44(local_d0._4_4_,0x18);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index(i, j)])","24",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x4d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)pbVar2,
             (int *)&local_d0);
  pbVar2 = local_b8;
  pbVar1 = (bool *)0x0;
  while( true ) {
    local_d0 = pbVar1;
    local_c8 = pbVar1;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x57,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_d0,(unsigned_long *)&local_c8);
    local_c0 = local_b8 + (long)local_c8 * 4;
    local_d0 = pbVar2;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x59,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int **)&local_d0
               ,(int **)&local_c0);
    if (pbVar1 == (bool *)0x1e) break;
    local_d0 = (bool *)CONCAT44(local_d0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
               ,0x6a,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)pbVar2,
               (int *)&local_d0);
    pbVar1 = pbVar1 + 1;
    pbVar2 = pbVar2 + 4;
  }
  local_d0 = (bool *)CONCAT44(local_d0._4_4_,0x18);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index(i, j)])","24",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,100,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",(int *)pbVar2,
             (int *)&local_d0);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}